

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::SeparateProgramsFragment::Run(SeparateProgramsFragment *this)

{
  uint uVar1;
  char *pcVar2;
  uint program;
  mapped_type *pmVar3;
  allocator<char> local_681;
  key_type local_680;
  allocator<char> local_659;
  key_type local_658;
  undefined4 local_638;
  undefined4 local_634;
  GLint expected7 [11];
  GLenum props7 [11];
  allocator<char> local_5d1;
  key_type local_5d0;
  allocator<char> local_5a9;
  key_type local_5a8;
  undefined4 local_588;
  undefined4 local_584;
  GLint expected6 [7];
  GLenum props6 [7];
  undefined8 uStack_528;
  GLint expected5 [13];
  undefined8 uStack_4e8;
  GLenum props5 [13];
  allocator<char> local_4a9;
  key_type local_4a8;
  undefined8 uStack_488;
  GLint expected3 [11];
  GLenum props3 [11];
  undefined8 uStack_408;
  GLint expected2 [10];
  undefined8 uStack_3d8;
  GLenum props2 [10];
  allocator<char> local_3a1;
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [39];
  allocator<char> local_351;
  key_type local_350;
  allocator<char> local_329;
  string local_328 [39];
  allocator<char> local_301;
  key_type local_300;
  allocator<char> local_2d9;
  string local_2d8 [39];
  allocator<char> local_2b1;
  key_type local_2b0;
  allocator<char> local_289;
  string local_288 [39];
  allocator<char> local_261;
  key_type local_260;
  allocator<char> local_239;
  string local_238 [39];
  allocator<char> local_211;
  key_type local_210;
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  string local_1c0 [39];
  allocator<char> local_199;
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [55];
  allocator<char> local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesU;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesO;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesBV;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indicesSSB;
  char *pcStack_20;
  GLuint tcs;
  char *srcTCS;
  long error;
  SeparateProgramsFragment *this_local;
  
  srcTCS = (char *)0x0;
  pcStack_20 = 
  "#version 430                                     \nout vec4 fs_color;                               \nlayout(location = 1) uniform vec4 x;             \nlayout(binding = 0) buffer SimpleBuffer {        \n   vec4 a;                                       \n};                                               \nin vec4 vs_color;                                \nvoid main() {                                    \n   fs_color = vs_color + x + a;                  \n}"
  ;
  error = (long)this;
  program = (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x18])
                      (this,0x8b30,1,&stack0xffffffffffffffe0);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e3,0x92f5,1,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e4,0x92f6,9,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e4,0x92f5,1,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e1,0x92f6,2,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e1,0x92f5,1,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e5,0x92f6,2,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e5,0x92f5,1,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f5,1,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f6,0xd,&srcTCS);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xd])(this,(ulong)program,0x92e6,0x92f7,1,&srcTCS);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"vs_color",&local_139);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e3,&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_138,&srcTCS);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"fs_color",&local_171);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e4,&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_170,&srcTCS);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"x",&local_199);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])(this,(ulong)program,0x92e1,local_118,local_198,&srcTCS);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"SimpleBuffer",&local_1c1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e6,&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_1c0,&srcTCS);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e8,"a",&local_1e9);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)program,0x92e5,&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,
             local_1e8,&srcTCS);
  std::__cxx11::string::~string(local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"SimpleBuffer",&local_211)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_210);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"SimpleBuffer",&local_239);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e6,(ulong)uVar1,local_238,&srcTCS);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator(&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"a",&local_261);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_260);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_288,"a",&local_289);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e5,(ulong)uVar1,local_288,&srcTCS);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"vs_color",&local_2b1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_2b0);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2d8,"vs_color",&local_2d9);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e3,(ulong)uVar1,local_2d8,&srcTCS);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"fs_color",&local_301);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_300);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_328,"fs_color",&local_329);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e4,(ulong)uVar1,local_328,&srcTCS);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"x",&local_351);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_118,&local_350);
  uVar1 = *pmVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"x",&local_379);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)program,0x92e1,(ulong)uVar1,local_378,&srcTCS);
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"x",&local_3a1);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x11])(this,(ulong)program,0x92e1,local_3a0,1,&srcTCS);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  props2[6] = 0x9306;
  props2[7] = 0x92e7;
  props2[2] = 0x930a;
  props2[3] = 0x9309;
  props2[4] = 0x9307;
  props2[5] = 0x9308;
  uStack_3d8 = 0x92fa000092f9;
  props2[0] = 0x92fb;
  props2[1] = 0x930b;
  expected2[4] = 0;
  expected2[5] = 0;
  expected2[6] = 0;
  expected2[7] = 0;
  uStack_408 = 0x8b5200000009;
  expected2[0] = 1;
  expected2[1] = 0;
  expected2[2] = 1;
  expected2[3] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(props3 + 10),"vs_color",(allocator<char> *)((long)props3 + 0x27));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (key_type *)(props3 + 10));
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e3,(ulong)*pmVar3,10,&uStack_3d8,10,&uStack_408,&srcTCS);
  std::__cxx11::string::~string((string *)(props3 + 10));
  std::allocator<char>::~allocator((allocator<char> *)((long)props3 + 0x27));
  props3[6] = 0x9306;
  props3[7] = 0x92e7;
  props3[8] = 0x930f;
  props3[2] = 0x930a;
  props3[3] = 0x9309;
  props3[4] = 0x9307;
  props3[5] = 0x9308;
  stack0xfffffffffffffba8 = 0x92fa000092f9;
  props3[0] = 0x92fb;
  props3[1] = 0x930b;
  expected3[6] = 0;
  expected3[7] = 0;
  expected3[8] = 0;
  expected3[4] = 0;
  expected3[5] = 0;
  uStack_488 = 0x8b5200000009;
  expected3[0] = 1;
  expected3[1] = 0;
  expected3[2] = 1;
  expected3[3] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,"fs_color",&local_4a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_4a8);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e4,(ulong)*pmVar3,0xb,expected3 + 10,0xb,&uStack_488,&srcTCS);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
  props5[6] = 0x9301;
  props5[7] = 0x930b;
  props5[8] = 0x930a;
  props5[9] = 0x9306;
  props5[2] = 0x92fd;
  props5[3] = 0x92fe;
  props5[4] = 0x92ff;
  props5[5] = 0x9300;
  uStack_4e8 = 0x92fa000092f9;
  props5[0] = 0x92fb;
  props5[1] = 0x92fc;
  props5[10] = 0x930e;
  expected5[6] = -1;
  expected5[7] = 0;
  expected5[8] = 1;
  expected5[9] = 0;
  expected5[2] = -1;
  expected5[3] = -1;
  expected5[4] = -1;
  expected5[5] = 0;
  uStack_528 = 0x8b5200000002;
  expected5[0] = 1;
  expected5[1] = -1;
  expected5[10] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(props6 + 6),"x",(allocator<char> *)((long)props6 + 0x17));
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_118,(key_type *)(props6 + 6));
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e1,(ulong)*pmVar3,0xd,&uStack_4e8,0xd,&uStack_528,&srcTCS);
  std::__cxx11::string::~string((string *)(props6 + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)props6 + 0x17));
  props6[2] = 0x930a;
  props6[3] = 0x9306;
  props6[4] = 0x9305;
  stack0xfffffffffffffa98 = 0x9302000092f9;
  props6[0] = 0x9304;
  props6[1] = 0x930b;
  local_588 = 0xd;
  local_584 = 0;
  expected6[0] = 1;
  expected6[1] = 0;
  expected6[2] = 1;
  expected6[3] = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"a",&local_5a9);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5a8);
  expected6[4] = *pmVar3;
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"SimpleBuffer",&local_5d1)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_5d0);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e6,(ulong)*pmVar3,7,expected6 + 6,7,&local_588,&srcTCS);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  stack0xfffffffffffff9f8 = 0x92fa000092f9;
  local_638 = 2;
  local_634 = 0x8b52;
  expected7[0] = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_658,"SimpleBuffer",&local_659)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_658);
  expected7[1] = *pmVar3;
  expected7[2] = 0;
  expected7[3] = 0;
  expected7[4] = 0;
  expected7[5] = 1;
  expected7[6] = 0;
  expected7[7] = 1;
  expected7[8] = 0;
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"a",&local_681);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_680);
  (*(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.super_SubcaseBase.
    super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)program,0x92e5,(ulong)*pmVar3,0xb,expected7 + 10,0xb,&local_638,&srcTCS);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SeparateProgramsVertex).super_SimpleShaders.super_PIQBase.
              super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,program);
  pcVar2 = srcTCS;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_118);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesU._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesO._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesI._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)&indicesBV._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (long)pcVar2;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		const char* srcTCS = "#version 430                                     \n"
							 "out vec4 fs_color;                               \n"
							 ""
							 "layout(location = 1) uniform vec4 x;             \n"
							 ""
							 "layout(binding = 0) buffer SimpleBuffer {        \n"
							 "   vec4 a;                                       \n"
							 "};                                               \n"
							 ""
							 "in vec4 vs_color;                                \n"
							 "void main() {                                    \n"
							 "   fs_color = vs_color + x + a;                  \n"
							 "}";

		const GLuint tcs = CreateShaderProgram(GL_FRAGMENT_SHADER, 1, &srcTCS);

		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_OUTPUT, GL_MAX_NAME_LENGTH, 9, error);
		VerifyGetProgramInterfaceiv(tcs, GL_PROGRAM_OUTPUT, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_UNIFORM, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(tcs, GL_UNIFORM, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_BUFFER_VARIABLE, GL_MAX_NAME_LENGTH, 2, error);
		VerifyGetProgramInterfaceiv(tcs, GL_BUFFER_VARIABLE, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_ACTIVE_RESOURCES, 1, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_MAX_NAME_LENGTH, 13, error);
		VerifyGetProgramInterfaceiv(tcs, GL_SHADER_STORAGE_BLOCK, GL_MAX_NUM_ACTIVE_VARIABLES, 1, error);

		std::map<std::string, GLuint> indicesSSB;
		std::map<std::string, GLuint> indicesBV;
		std::map<std::string, GLuint> indicesI;
		std::map<std::string, GLuint> indicesO;
		std::map<std::string, GLuint> indicesU;
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_INPUT, indicesI, "vs_color", error);
		VerifyGetProgramResourceIndex(tcs, GL_PROGRAM_OUTPUT, indicesO, "fs_color", error);
		VerifyGetProgramResourceIndex(tcs, GL_UNIFORM, indicesU, "x", error);
		VerifyGetProgramResourceIndex(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB, "SimpleBuffer", error);
		VerifyGetProgramResourceIndex(tcs, GL_BUFFER_VARIABLE, indicesBV, "a", error);

		VerifyGetProgramResourceName(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB["SimpleBuffer"], "SimpleBuffer", error);
		VerifyGetProgramResourceName(tcs, GL_BUFFER_VARIABLE, indicesBV["a"], "a", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_INPUT, indicesI["vs_color"], "vs_color", error);
		VerifyGetProgramResourceName(tcs, GL_PROGRAM_OUTPUT, indicesO["fs_color"], "fs_color", error);
		VerifyGetProgramResourceName(tcs, GL_UNIFORM, indicesU["x"], "x", error);

		VerifyGetProgramResourceLocation(tcs, GL_UNIFORM, "x", 1, error);

		GLenum props2[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH };
		GLint expected2[] = { 9, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_INPUT, indicesI["vs_color"], 10, props2, 10, expected2, error);

		GLenum props3[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_GEOMETRY_SHADER,
							GL_REFERENCED_BY_TESS_CONTROL_SHADER,
							GL_REFERENCED_BY_TESS_EVALUATION_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_IS_PER_PATCH,
							GL_LOCATION_INDEX };
		GLint expected3[] = { 9, GL_FLOAT_VEC4, 1, 0, 1, 0, 0, 0, 0, 0, 0 };
		VerifyGetProgramResourceiv(tcs, GL_PROGRAM_OUTPUT, indicesO["fs_color"], 11, props3, 11, expected3, error);

		GLenum props5[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_OFFSET,
							GL_BLOCK_INDEX,
							GL_ARRAY_STRIDE,
							GL_MATRIX_STRIDE,
							GL_IS_ROW_MAJOR,
							GL_ATOMIC_COUNTER_BUFFER_INDEX,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_LOCATION };
		GLint expected5[] = { 2, GL_FLOAT_VEC4, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, 1 };
		VerifyGetProgramResourceiv(tcs, GL_UNIFORM, indicesU["x"], 13, props5, 13, expected5, error);

		GLenum props6[] = { GL_NAME_LENGTH,
							GL_BUFFER_BINDING,
							GL_NUM_ACTIVE_VARIABLES,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_ACTIVE_VARIABLES };
		GLint expected6[] = { 13, 0, 1, 0, 1, 0, static_cast<GLint>(indicesBV["a"]) };
		VerifyGetProgramResourceiv(tcs, GL_SHADER_STORAGE_BLOCK, indicesSSB["SimpleBuffer"], 7, props6, 7, expected6,
								   error);

		GLenum props7[] = { GL_NAME_LENGTH,
							GL_TYPE,
							GL_ARRAY_SIZE,
							GL_BLOCK_INDEX,
							GL_ARRAY_STRIDE,
							GL_IS_ROW_MAJOR,
							GL_REFERENCED_BY_COMPUTE_SHADER,
							GL_REFERENCED_BY_FRAGMENT_SHADER,
							GL_REFERENCED_BY_VERTEX_SHADER,
							GL_TOP_LEVEL_ARRAY_SIZE,
							GL_TOP_LEVEL_ARRAY_STRIDE };
		GLint expected7[] = {
			2, GL_FLOAT_VEC4, 1, static_cast<GLint>(indicesSSB["SimpleBuffer"]), 0, 0, 0, 1, 0, 1, 0
		};
		VerifyGetProgramResourceiv(tcs, GL_BUFFER_VARIABLE, indicesBV["a"], 11, props7, 11, expected7, error);

		glDeleteProgram(tcs);
		return error;
	}